

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_0::TestChild::TestChild(TestChild *this,UnixEventPort *port,int exitCode)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  Timer TVar3;
  __pid_t _Var4;
  int iVar5;
  Promise<int> PVar6;
  Fault f;
  sigset_t sigs;
  Fault local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  
  (this->pid).ptr.isSet = false;
  (this->promise).super_PromiseBase.node.disposer = (Disposer *)0x0;
  (this->promise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  do {
    _Var4 = fork();
    if (-1 < _Var4) {
      if (_Var4 == 0) {
        (anonymous_namespace)::exitCodeForSignal = exitCode;
        signal(0xf,exitSignalHandler);
        sigemptyset((sigset_t *)&stack0xffffffffffffff58);
        sigaddset((sigset_t *)&stack0xffffffffffffff58,0xf);
        sigprocmask(1,(sigset_t *)&stack0xffffffffffffff58,(sigset_t *)0x0);
        do {
          pause();
        } while( true );
      }
      goto LAB_001e1235;
    }
    iVar5 = _::Debug::getOsErrorNumber(false);
  } while (iVar5 == -1);
  if (iVar5 != 0) {
    local_b0.exception = (Exception *)0x0;
    _local_a8 = (_func_int **)0x0;
    _uStack_a0 = (_func_int **)0x0;
    _::Debug::Fault::init
              (&local_b0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal(&local_b0);
  }
LAB_001e1235:
  (this->pid).ptr.field_1.value = _Var4;
  (this->pid).ptr.isSet = true;
  PVar6 = UnixEventPort::onChildExit((UnixEventPort *)&stack0xffffffffffffff58,(Maybe<int> *)port);
  pDVar1 = (this->promise).super_PromiseBase.node.disposer;
  pPVar2 = (this->promise).super_PromiseBase.node.ptr;
  *(undefined4 *)&(this->promise).super_PromiseBase.node.disposer = local_a8;
  *(undefined4 *)((long)&(this->promise).super_PromiseBase.node.disposer + 4) = uStack_a4;
  *(undefined4 *)&(this->promise).super_PromiseBase.node.ptr = uStack_a0;
  *(undefined4 *)((long)&(this->promise).super_PromiseBase.node.ptr + 4) = uStack_9c;
  _uStack_a0 = (_func_int **)0x0;
  if (pPVar2 != (PromiseNode *)0x0) {
    (**pDVar1->_vptr_Disposer)
              (pDVar1,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode,
               PVar6.super_PromiseBase.node.ptr);
    TVar3._vptr_Timer = _uStack_a0;
    if (_uStack_a0 != (_func_int **)0x0) {
      _uStack_a0 = (_func_int **)0x0;
      (**(code **)*_local_a8)
                (_local_a8,(long)TVar3._vptr_Timer + *(long *)(*TVar3._vptr_Timer + -0x10));
    }
  }
  return;
}

Assistant:

TestChild(UnixEventPort& port, int exitCode) {
    pid_t p;
    KJ_SYSCALL(p = fork());
    if (p == 0) {
      // Arrange for SIGTERM to cause the process to exit normally.
      exitCodeForSignal = exitCode;
      signal(SIGTERM, &exitSignalHandler);
      sigset_t sigs;
      sigemptyset(&sigs);
      sigaddset(&sigs, SIGTERM);
      sigprocmask(SIG_UNBLOCK, &sigs, nullptr);

      for (;;) pause();
    }
    pid = p;
    promise = port.onChildExit(pid);
  }